

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

void __thiscall QMakeEvaluator::setTemplate(QMakeEvaluator *this)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<ProString> *this_00;
  iterator aend;
  iterator iVar3;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_ProString_&> local_b0;
  ProString local_a0;
  QArrayDataPointer<ProString> local_70;
  ProString val;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<ProString> *)
            valuesRef(this,(ProKey *)(QMakeInternal::statics + 0x150));
  if ((this->m_option->user_template).d.size == 0) {
    if (this_00->size != 0) {
      iVar3 = QList<ProString>::begin((QList<ProString> *)this_00);
      aend = QList<ProString>::end((QList<ProString> *)this_00);
      QList<ProString>::erase((QList<ProString> *)this_00,iVar3.i + 1,(const_iterator)aend.i);
      goto LAB_001f8c20;
    }
    ProString::ProString(&val,"app");
    QList<ProString>::emplaceBack<ProString>((QList<ProString> *)this_00,&val);
  }
  else {
    ProString::ProString(&val,&this->m_option->user_template);
    ProStringList::ProStringList((ProStringList *)&local_a0,&val);
    QArrayDataPointer<ProString>::operator=(this_00,(QArrayDataPointer<ProString> *)&local_a0);
    QArrayDataPointer<ProString>::~QArrayDataPointer((QArrayDataPointer<ProString> *)&local_a0);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&val);
LAB_001f8c20:
  if ((this->m_option->user_template_prefix).d.size != 0) {
    val.m_file = -0x55555556;
    val._36_4_ = 0xaaaaaaaa;
    val.m_hash = 0xaaaaaaaaaaaaaaaa;
    val.m_string.d.size = -0x5555555555555556;
    val.m_offset = -0x55555556;
    val.m_length = -0x55555556;
    val.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    val.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    iVar3 = QList<ProString>::begin((QList<ProString> *)this_00);
    ProString::ProString(&val,iVar3.i);
    bVar2 = ProString::startsWith(&val,&this->m_option->user_template_prefix,CaseSensitive);
    if (!bVar2) {
      local_b0.a = &this->m_option->user_template_prefix;
      local_b0.b = &val;
      ProString::ProString<QString&,ProString&>(&local_a0,&local_b0);
      ProStringList::ProStringList((ProStringList *)&local_70,&local_a0);
      QArrayDataPointer<ProString>::operator=(this_00,&local_70);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a0);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&val);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeEvaluator::setTemplate()
{
    ProStringList &values = valuesRef(statics.strTEMPLATE);
    if (!m_option->user_template.isEmpty()) {
        // Don't allow override
        values = ProStringList(ProString(m_option->user_template));
    } else {
        if (values.isEmpty())
            values.append(ProString("app"));
        else
            values.erase(values.begin() + 1, values.end());
    }
    if (!m_option->user_template_prefix.isEmpty()) {
        ProString val = values.first();
        if (!val.startsWith(m_option->user_template_prefix))
            values = ProStringList(ProString(m_option->user_template_prefix + val));
    }
}